

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O3

void __thiscall
CUI::Init(CUI *this,CConfig *pConfig,IGraphics *pGraphics,IInput *pInput,ITextRender *pTextRender)

{
  this->m_pConfig = pConfig;
  this->m_pGraphics = pGraphics;
  this->m_pInput = pInput;
  this->m_pTextRender = pTextRender;
  CUIRect::s_pGraphics = pGraphics;
  CLineInput::s_pInput = pInput;
  CLineInput::s_pTextRender = pTextRender;
  CLineInput::s_pGraphics = pGraphics;
  return;
}

Assistant:

void CUI::Init(class CConfig *pConfig, class IGraphics *pGraphics, class IInput *pInput, class ITextRender *pTextRender)
{
	m_pConfig = pConfig;
	m_pGraphics = pGraphics;
	m_pInput = pInput;
	m_pTextRender = pTextRender;
	CUIRect::Init(pGraphics);
	CLineInput::Init(pInput, pTextRender, pGraphics);
}